

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

PreserveOrderType __thiscall
duckdb::Deserializer::ReadPropertyWithExplicitDefault<duckdb::PreserveOrderType>
          (Deserializer *this,field_id_t field_id,char *tag,PreserveOrderType default_value)

{
  uint uVar1;
  undefined6 in_register_00000032;
  
  uVar1 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  if ((char)uVar1 != '\0') {
    default_value = Read<duckdb::PreserveOrderType>(this);
  }
  (*this->_vptr_Deserializer[5])(this,(ulong)(uVar1 & 0xff));
  return default_value;
}

Assistant:

inline T ReadPropertyWithExplicitDefault(const field_id_t field_id, const char *tag, T default_value) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(default_value);
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}